

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O3

bool operator!=(QByteArray *lhs,char **rhs)

{
  char *__s2;
  long lVar1;
  int iVar2;
  size_t __n;
  bool bVar3;
  
  __s2 = *rhs;
  if (__s2 != (char *)0x0) {
    __n = 0xffffffffffffffff;
    do {
      lVar1 = __n + 1;
      __n = __n + 1;
    } while (__s2[lVar1] != '\0');
    bVar3 = true;
    if ((lhs->d).size == __n) {
      if (__n == 0) {
        bVar3 = false;
      }
      else {
        iVar2 = bcmp((lhs->d).ptr,__s2,__n);
        bVar3 = iVar2 != 0;
      }
    }
    return bVar3;
  }
  return (lhs->d).size != 0;
}

Assistant:

constexpr QByteArrayView(const Pointer &data) noexcept
        : QByteArrayView(
              data, data ? QtPrivate::lengthHelperPointer(data) : 0) {}